

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpge.cpp
# Opt level: O0

bool __thiscall jpge::jpeg_encoder::process_end_of_image(jpeg_encoder *this)

{
  jpeg_encoder *in_RDI;
  int i;
  uint local_14;
  jpeg_encoder *this_00;
  bool local_1;
  
  if (in_RDI->m_mcu_y_ofs != '\0') {
    this_00 = in_RDI;
    if (in_RDI->m_mcu_y_ofs < 0x10) {
      for (local_14 = (uint)in_RDI->m_mcu_y_ofs; (int)local_14 < in_RDI->m_mcu_y;
          local_14 = local_14 + 1) {
        memcpy(in_RDI->m_mcu_lines[(int)local_14],
               in_RDI->m_mcu_lines[(int)(in_RDI->m_mcu_y_ofs - 1)],(long)in_RDI->m_image_bpl_mcu);
      }
    }
    process_mcu_row(this_00);
  }
  if (in_RDI->m_pass_num == '\x01') {
    local_1 = terminate_pass_one(in_RDI);
  }
  else {
    local_1 = terminate_pass_two(in_RDI);
  }
  return local_1;
}

Assistant:

bool jpeg_encoder::process_end_of_image() {
  if (m_mcu_y_ofs) {
    if (m_mcu_y_ofs < 16)  // check here just to shut up static analysis
    {
      for (int i = m_mcu_y_ofs; i < m_mcu_y; i++)
        memcpy(m_mcu_lines[i], m_mcu_lines[m_mcu_y_ofs - 1], m_image_bpl_mcu);
    }

    process_mcu_row();
  }

  if (m_pass_num == 1)
    return terminate_pass_one();
  else
    return terminate_pass_two();
}